

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<void_(*)(const_QDBusMessage_&)>::relocate
          (QArrayDataPointer<void_(*)(const_QDBusMessage_&)> *this,qsizetype offset,
          _func_void_QDBusMessage_ptr ***data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<void_(*)(const_QDBusMessage_&)> *in_RDI;
  _func_void_QDBusMessage_ptr ***unaff_retaddr;
  _func_void_QDBusMessage_ptr **res;
  _func_void_QDBusMessage_ptr **first;
  QArrayDataPointer<void_(*)(const_QDBusMessage_&)> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<void(*)(QDBusMessage_const&),long_long>
            (first,(longlong)in_RDI,(_func_void_QDBusMessage_ptr **)0x1784b7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<void(*)(QDBusMessage_const&)>,void(*const*)(QDBusMessage_const&)>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }